

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

Fad<double> *
TPZMatrix<Fad<double>_>::ReturnNearestValue
          (Fad<double> *__return_storage_ptr__,Fad<double> *val,TPZVec<Fad<double>_> *Vec,
          Fad<double> *tol)

{
  Vector<double> *this;
  double dVar1;
  uint uVar2;
  Fad<double> *pFVar3;
  uint uVar4;
  MEM_CPY<double> *pMVar5;
  uint uVar6;
  long lVar7;
  double *pdVar8;
  Vector<double> *a;
  ulong uVar9;
  double *pdVar10;
  MEM_CPY<double> *pMVar11;
  TPZVec<Fad<double>_> *pTVar12;
  long lVar13;
  Fad<double> diff0;
  Fad<double> diff1;
  Fad<double> exps;
  undefined1 local_e0 [24];
  double dStack_c8;
  Fad<double> *local_c0;
  undefined1 local_b8 [24];
  double local_a0;
  TPZVec<Fad<double>_> *local_98;
  Fad<double> *local_90;
  Fad<double> local_88;
  Vector<double> *local_68;
  Fad<double> local_60;
  FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> local_40;
  
  pFVar3 = Vec->fStore;
  dVar1 = pFVar3->val_;
  uVar6 = (pFVar3->dx_).num_elts;
  local_e0._16_8_ = (MEM_CPY<double> *)0x0;
  local_e0._0_8_ = dVar1;
  local_e0._8_4_ = uVar6;
  local_c0 = val;
  local_98 = Vec;
  local_90 = tol;
  if ((long)(int)uVar6 == 0) {
    pMVar5 = (MEM_CPY<double> *)0x0;
  }
  else {
    uVar9 = 0xffffffffffffffff;
    if (-1 < (int)uVar6) {
      uVar9 = (long)(int)uVar6 * 8;
    }
    pMVar5 = (MEM_CPY<double> *)operator_new__(uVar9);
    local_e0._16_8_ = pMVar5;
    MEM_CPY<double>::copy
              (pMVar5,(EVP_PKEY_CTX *)(pFVar3->dx_).ptr_to_data,(EVP_PKEY_CTX *)(ulong)uVar6);
  }
  dStack_c8 = pFVar3->defaultVal;
  local_88.val_ = local_c0->val_ - dVar1;
  uVar2 = (local_c0->dx_).num_elts;
  uVar4 = uVar6;
  if ((int)uVar6 < (int)uVar2) {
    uVar4 = uVar2;
  }
  local_88.dx_.num_elts = 0;
  local_88.dx_.ptr_to_data = (double *)0x0;
  if (0 < (int)uVar4) {
    local_88.dx_.num_elts = uVar4;
    local_88.dx_.ptr_to_data = (double *)operator_new__((ulong)uVar4 * 8);
    local_88.defaultVal = 0.0;
    pdVar8 = (local_c0->dx_).ptr_to_data;
    uVar9 = 0;
    do {
      pdVar10 = pdVar8;
      if (uVar2 == 0) {
        pdVar10 = &local_c0->defaultVal;
      }
      pMVar11 = pMVar5;
      if (uVar6 == 0) {
        pMVar11 = (MEM_CPY<double> *)&dStack_c8;
      }
      local_88.dx_.ptr_to_data[uVar9] = *pdVar10 - *(double *)pMVar11;
      uVar9 = uVar9 + 1;
      pMVar5 = pMVar5 + 8;
      pdVar8 = pdVar8 + 1;
    } while (uVar4 != uVar9);
  }
  local_88.defaultVal = 0.0;
  Fad<double>::~Fad((Fad<double> *)local_e0);
  pTVar12 = local_98;
  if (ABS(local_90->val_) <= ABS(local_88.val_)) {
    pFVar3 = local_98->fStore;
    local_b8._0_8_ = pFVar3->val_;
    uVar6 = (pFVar3->dx_).num_elts;
    local_b8._16_8_ = (MEM_CPY<double> *)0x0;
    local_b8._8_4_ = uVar6;
    if ((long)(int)uVar6 == 0) {
      uVar6 = 0;
    }
    else {
      uVar9 = 0xffffffffffffffff;
      if (-1 < (int)uVar6) {
        uVar9 = (long)(int)uVar6 * 8;
      }
      local_b8._16_8_ = operator_new__(uVar9);
      MEM_CPY<double>::copy
                ((MEM_CPY<double> *)local_b8._16_8_,(EVP_PKEY_CTX *)(pFVar3->dx_).ptr_to_data,
                 (EVP_PKEY_CTX *)(ulong)uVar6);
      uVar6 = local_b8._8_4_;
    }
    local_a0 = pFVar3->defaultVal;
    local_e0._0_8_ = local_c0->val_ - (double)local_b8._0_8_;
    uVar2 = (local_c0->dx_).num_elts;
    uVar4 = uVar6;
    if ((int)uVar6 < (int)uVar2) {
      uVar4 = uVar2;
    }
    local_e0._8_4_ = 0;
    local_e0._16_8_ = (double *)0x0;
    if (0 < (int)uVar4) {
      local_e0._8_4_ = uVar4;
      local_e0._16_8_ = operator_new__((ulong)uVar4 * 8);
      dStack_c8 = 0.0;
      pdVar8 = (local_c0->dx_).ptr_to_data;
      uVar9 = 0;
      pMVar5 = (MEM_CPY<double> *)local_b8._16_8_;
      do {
        pdVar10 = pdVar8;
        if (uVar2 == 0) {
          pdVar10 = &local_c0->defaultVal;
        }
        pMVar11 = pMVar5;
        if (uVar6 == 0) {
          pMVar11 = (MEM_CPY<double> *)&local_a0;
        }
        *(double *)(local_e0._16_8_ + uVar9 * 8) = *pdVar10 - *(double *)pMVar11;
        uVar9 = uVar9 + 1;
        pMVar5 = pMVar5 + 8;
        pdVar8 = pdVar8 + 1;
      } while (uVar4 != uVar9);
    }
    dStack_c8 = 0.0;
    Fad<double>::~Fad((Fad<double> *)local_b8);
  }
  else {
    local_e0._0_8_ = 10000000000.0;
    local_e0._8_4_ = 0;
    local_e0._16_8_ = (double *)0x0;
    dStack_c8 = 0.0;
  }
  Fad<double>::Fad((Fad<double> *)local_b8);
  pFVar3 = pTVar12->fStore;
  __return_storage_ptr__->val_ = pFVar3->val_;
  uVar6 = (pFVar3->dx_).num_elts;
  (__return_storage_ptr__->dx_).num_elts = uVar6;
  (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
  if ((long)(int)uVar6 != 0) {
    uVar9 = 0xffffffffffffffff;
    if (-1 < (int)uVar6) {
      uVar9 = (long)(int)uVar6 * 8;
    }
    pMVar5 = (MEM_CPY<double> *)operator_new__(uVar9);
    (__return_storage_ptr__->dx_).ptr_to_data = (double *)pMVar5;
    MEM_CPY<double>::copy
              (pMVar5,(EVP_PKEY_CTX *)(pFVar3->dx_).ptr_to_data,(EVP_PKEY_CTX *)(ulong)uVar6);
  }
  __return_storage_ptr__->defaultVal = pFVar3->defaultVal;
  if (1 < pTVar12->fNElements) {
    this = (Vector<double> *)(local_e0 + 8);
    local_68 = &__return_storage_ptr__->dx_;
    lVar7 = 1;
    lVar13 = 0x38;
    do {
      pFVar3 = pTVar12->fStore;
      local_60.val_ = *(double *)((long)pFVar3 + lVar13 + -0x18);
      uVar6 = *(uint *)((long)pFVar3 + lVar13 + -0x10);
      local_60.dx_.ptr_to_data = (double *)0x0;
      local_60.dx_.num_elts = uVar6;
      if ((long)(int)uVar6 != 0) {
        uVar9 = (long)(int)uVar6 * 8;
        if ((int)uVar6 < 0) {
          uVar9 = 0xffffffffffffffff;
        }
        local_60.dx_.ptr_to_data = (double *)operator_new__(uVar9);
        MEM_CPY<double>::copy
                  ((MEM_CPY<double> *)local_60.dx_.ptr_to_data,
                   *(EVP_PKEY_CTX **)((long)pFVar3 + lVar13 + -8),(EVP_PKEY_CTX *)(ulong)uVar6);
      }
      local_60.defaultVal = *(double *)((long)&pFVar3->val_ + lVar13);
      local_40.fadexpr_.left_ = local_c0;
      local_40.fadexpr_.right_ = &local_60;
      Fad<double>::operator=((Fad<double> *)local_b8,&local_40);
      Fad<double>::~Fad(&local_60);
      pTVar12 = local_98;
      pdVar8 = (double *)local_e0;
      a = this;
      if ((ABS(local_90->val_) <= ABS((double)local_b8._0_8_)) &&
         (ABS((double)local_b8._0_8_) < ABS((double)local_e0._0_8_))) {
        pFVar3 = local_98->fStore;
        __return_storage_ptr__->val_ = *(double *)((long)pFVar3 + lVar13 + -0x18);
        Vector<double>::operator=(local_68,(Vector<double> *)((long)pFVar3 + lVar13 + -0x10));
        __return_storage_ptr__->defaultVal = *(double *)((long)&pFVar3->val_ + lVar13);
        a = (Vector<double> *)(local_b8 + 8);
        pdVar8 = (double *)local_b8;
      }
      local_e0._0_8_ = *pdVar8;
      Vector<double>::operator=(this,a);
      dStack_c8 = pdVar8[3];
      lVar7 = lVar7 + 1;
      lVar13 = lVar13 + 0x20;
    } while (lVar7 < pTVar12->fNElements);
  }
  Fad<double>::~Fad((Fad<double> *)local_b8);
  Fad<double>::~Fad((Fad<double> *)local_e0);
  Fad<double>::~Fad(&local_88);
  return __return_storage_ptr__;
}

Assistant:

TVar TPZMatrix<TVar>::ReturnNearestValue(TVar val, TPZVec<TVar>& Vec, TVar tol)
{
    TVar exps = val - (TVar)Vec[0];
    TVar diff0 = fabs(exps) >= fabs(tol) ?  (val - (TVar)Vec[0]) : (TVar)1.E10;
    TVar diff1, res = (TVar)Vec[0];
    for(int64_t i = 1; i < Vec.NElements(); i++)
    {
        diff1 = val - (TVar)Vec[i];
        diff0 = ( fabs(diff1) >= fabs(tol) && fabs(diff1) < fabs(diff0) ) ? res = Vec[i],diff1 : diff0;
    }
    return res;
}